

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompileTest.cpp
# Opt level: O3

void CompiledMixedType<short,long>(void)

{
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> SVar1;
  short ret;
  short ret_3;
  short ret_7;
  short local_42;
  ulong local_40;
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> local_34;
  short local_32;
  
  local_34.m_int = 0;
  local_40 = 0;
  local_42 = 0;
  MultiplicationHelper<short,_long,_14>::
  MultiplyThrow<safeint_exception_handlers::SafeInt_InvalidParameter>(0,(long *)&local_40,&local_42)
  ;
  local_40 = 0;
  local_42 = 0;
  MultiplicationHelper<short,_long,_14>::
  MultiplyThrow<safeint_exception_handlers::SafeInt_InvalidParameter>(0,(long *)&local_40,&local_42)
  ;
  local_40 = 0;
  MultiplicationHelper<short,_long,_14>::
  MultiplyThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
            (0,(long *)&local_40,&local_34.m_int);
  local_40 = 0;
  MultiplicationHelper<short,_long,_14>::
  MultiplyThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
            (local_34.m_int,(long *)&local_40,&local_34.m_int);
  local_34.m_int = 1;
  local_40 = 1;
  local_42 = 0;
  DivisionHelper<short,_long,_5>::DivideThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
            (&local_34.m_int,(long *)&local_40,&local_42);
  local_40 = local_40 & 0xffffffffffff0000;
  local_42 = 1;
  DivisionHelper<short,_short,_5>::DivideThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
            (&local_34.m_int,&local_42,(short *)&local_40);
  operator/(1,local_34);
  local_40 = 1;
  DivisionHelper<short,_long,_5>::DivideThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
            (&local_34.m_int,(long *)&local_40,&local_34.m_int);
  local_40 = 1;
  DivisionHelper<short,_long,_5>::DivideThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
            (&local_34.m_int,(long *)&local_40,&local_34.m_int);
  local_40 = 1;
  local_42 = 0;
  AdditionHelper<short,_long,_11>::
  AdditionThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
            (&local_34.m_int,(long *)&local_40,&local_42);
  if (0xfffeffff < (int)local_34.m_int - 0x7fffU) {
    local_40 = 1;
    local_42 = 0;
    local_32 = local_34.m_int;
    AdditionHelper<short,_long,_11>::
    AdditionThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
              (&local_32,(long *)&local_40,&local_42);
    local_40 = 1;
    AdditionHelper<short,_long,_11>::
    AdditionThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
              ((short *)&local_34,(long *)&local_40,(short *)&local_34);
    local_40 = 1;
    AdditionHelper<short,_long,_11>::
    AdditionThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
              ((short *)&local_34,(long *)&local_40,(short *)&local_34);
    local_34.m_int = 0;
    local_40 = 0;
    local_42 = 0;
    SubtractionHelper<short,_long,_8>::
    SubtractThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
              ((short *)&local_34,(long *)&local_40,&local_42);
    local_42 = local_34.m_int;
    local_40 = 0;
    local_32 = 0;
    SubtractionHelper<long,_short,_17>::
    SubtractThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
              ((long *)&local_40,&local_42,&local_32);
    local_40 = 0;
    SubtractionHelper<short,_long,_8>::
    SubtractThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
              ((short *)&local_34,(long *)&local_40,(short *)&local_34);
    local_34.m_int = 1;
    local_40 = 1;
    SubtractionHelper<short,_long,_8>::
    SubtractThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
              ((short *)&local_34,(long *)&local_40,(short *)&local_34);
    SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<
              ((SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_34,1);
    SVar1 = SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<
                      ((SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       &local_34,
                       (SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x1);
    operator<<(SVar1.m_int,(SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x1)
    ;
    SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<=
              ((SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_34,1);
    SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<=
              ((SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_34,
               (SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x1);
    SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>
              ((SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_34,1);
    SVar1 = SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>
                      ((SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       &local_34,
                       (SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x1);
    operator>>(SVar1.m_int,(SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x1)
    ;
    SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>=
              ((SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_34,1);
    SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>=
              ((SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_34,
               (SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x1);
    return;
  }
  safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
}

Assistant:

void CompiledMixedType()
{
	// Mixed constructors
	U u = 0;
	T t = 0;
	bool b = false;
	SafeInt<T> st(u);
	SafeInt<U> su(u);
	SafeInt<T> st2(su);

	// Shut up the compiler
	b = !b;

	// Assignment
	st = t;
	st = u;
	st = su;
	st = st2;

	// Casting
	U u2 = (U)st;

	// Multiplication
	t = st * u;
	t = st * st2;
	t = u * st;
	st *= u;
	st *= su;

	// Modulus, modulus assignment
	u = 1;
	st = 1;
	su = 1;
	// For some reason, this is annoying the VS17 link time code generation
//	t = u % st;

	t = st % u;
	st2 = 1;
	t = st % st2;
	st %= u;
	st %= su;

	// Division
	u = 1;
	st2 = 1;
	st = 1;
	t = st / u;
	t = st / st2;
	t = u / st;
	st /= u;
	st /= su;

	// Addition
	t = st + u;
	t = st + st2;
	t = u + st;
	st += u;
	st += su;

	// Subtraction
	st = 0;
	u = 0;
	st2 = 0;
	t = st - u;
	t = st - st2;
	t = u - st;
	st -= u;

	st = 1;
	su = 1;
	st -= su;

	// Shift operators
	u = 1;
	su = 1;
	// Left
	t = st << u;
	t = st << su;
	t = t << su;

	st <<= u;
	st <<= su;

	// Right
	t = st >> u;
	t = st >> su;
	t = t >> su;

	st >>= u;
	st >>= su;

	// Binary operations
	// And
	t = st & st2;
	t = st & u;
	t = t & su;

	st &= st2;
	st &= u;
	st &= su;

	// Or
	t = st | st2;
	t = st | u;
	t = t | su;

	st |= st2;
	st |= u;
	st |= su;

	// Xor
	t = st ^ st2;
	t = st ^ u;
	t = t ^ su;

	st ^= st2;
	st ^= u;
	st ^= su;

	// Comparisons
	// Less than
	b = st < su;
	b = st < u;
	b = u < st;
	b = st < su;

	// Less than or equal
	b = st <= su;
	b = st <= u;
	b = u <= st;
	b = st <= su;

	// Greater than
	b = st > su;
	b = st > u;
	b = u > st;
	b = st > su;

	// Greater than or equal
	b = st >= su;
	b = st >= u;
	b = u >= st;
	b = st >= su;

	// Equals
	b = st == su;
	b = st == u;
	b = u == st;
	b = st == su;
}